

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
::format(elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         *this,log_msg *msg,tm *param_2,memory_buf_t *dest)

{
  long lVar1;
  unsigned_long uVar2;
  unsigned_long value;
  char local_30 [21];
  char local_1b [3];
  char *local_18;
  
  lVar1 = (msg->time).__d.__r;
  uVar2 = lVar1 - (this->last_message_time_).__d.__r;
  value = 0;
  if (0 < (long)uVar2) {
    value = uVar2;
  }
  (this->last_message_time_).__d.__r = lVar1;
  local_18 = ::fmt::v11::detail::do_format_decimal<char,unsigned_long>(local_30,value,0x15);
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_18,local_1b);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        auto delta = (std::max)(msg.time - last_message_time_, log_clock::duration::zero());
        auto delta_units = std::chrono::duration_cast<DurationUnits>(delta);
        last_message_time_ = msg.time;
        auto delta_count = static_cast<size_t>(delta_units.count());
        auto n_digits = static_cast<size_t>(ScopedPadder::count_digits(delta_count));
        ScopedPadder p(n_digits, padinfo_, dest);
        fmt_helper::append_int(delta_count, dest);
    }